

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

RealType __thiscall OpenMD::SelectionEvaluator::getCharge(SelectionEvaluator *this,Atom *atom)

{
  bool bVar1;
  Atom *in_RSI;
  RealType RVar2;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  AtomType *atomType;
  RealType charge;
  FluctuatingChargeAdapter in_stack_ffffffffffffffd0;
  FixedChargeAdapter local_28;
  AtomType *local_20;
  RealType local_18;
  
  local_18 = 0.0;
  local_20 = Atom::getAtomType(in_RSI);
  FixedChargeAdapter::FixedChargeAdapter(&local_28,local_20);
  bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x3443bf);
  if (bVar1) {
    local_18 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_ffffffffffffffd0.at_);
  }
  FluctuatingChargeAdapter::FluctuatingChargeAdapter
            ((FluctuatingChargeAdapter *)&stack0xffffffffffffffd0,local_20);
  bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x3443ee);
  if (bVar1) {
    RVar2 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_ffffffffffffffd0.at_);
    local_18 = RVar2 + local_18;
  }
  return local_18;
}

Assistant:

RealType SelectionEvaluator::getCharge(Atom* atom) {
    RealType charge    = 0.0;
    AtomType* atomType = atom->getAtomType();

    FixedChargeAdapter fca = FixedChargeAdapter(atomType);
    if (fca.isFixedCharge()) { charge = fca.getCharge(); }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }
    return charge;
  }